

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassPosition
          (KinDynComputations *this,Span<double,__1L> pos)

{
  Span<double,__1L> vec;
  index_type iVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  bool ok;
  int expected_position_size;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff78;
  VectorFixSize<3U> *in_stack_ffffffffffffff98;
  extent_type<_1L> in_stack_ffffffffffffffa0;
  KinDynComputations *in_stack_ffffffffffffffa8;
  
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x1cd0f2);
  if (iVar1 == 3) {
    getCenterOfMassPosition(in_stack_ffffffffffffffa8);
    toEigen<3U>(in_stack_ffffffffffffff98);
    vec.storage_.data_ = (pointer)in_stack_ffffffffffffffa8;
    vec.storage_.super_extent_type<_1L>.size_ = in_stack_ffffffffffffffa0.size_;
    toEigen(vec);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              (in_RDI,in_stack_ffffffffffffff78);
  }
  else {
    iDynTree::reportError("KinDynComputations","getCenterOfMassPosition","Wrong size in input pos");
  }
  return iVar1 == 3;
}

Assistant:

bool KinDynComputations::getCenterOfMassPosition(Span<double> pos)
{
    constexpr int expected_position_size = 3;
    bool ok = pos.size() == expected_position_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCenterOfMassPosition","Wrong size in input pos");
        return false;
    }

    toEigen(pos) = toEigen(getCenterOfMassPosition());

    return true;
}